

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int libssh2_poll_channel_read(LIBSSH2_CHANNEL *channel,int extended)

{
  uint32_t uVar1;
  LIBSSH2_SESSION *session_00;
  int iVar2;
  uint32_t uVar3;
  list_node *local_30;
  LIBSSH2_PACKET *packet;
  LIBSSH2_SESSION *session;
  int extended_local;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local._4_4_ = -0x27;
  }
  else {
    session_00 = channel->session;
    for (local_30 = (list_node *)_libssh2_list_first(&session_00->packets);
        local_30 != (list_node *)0x0; local_30 = (list_node *)_libssh2_list_next(local_30)) {
      if (local_30[1].prev < (list_node *)0x5) {
        iVar2 = _libssh2_error(session_00,-0x26,"Packet too small");
        return iVar2;
      }
      uVar1 = (channel->local).id;
      uVar3 = _libssh2_ntohu32((uchar *)((long)&(local_30[1].next)->next + 1));
      if (uVar1 == uVar3) {
        if ((extended == 1) &&
           ((*(char *)&(local_30[1].next)->next == '_' ||
            (*(char *)&(local_30[1].next)->next == '^')))) {
          return 1;
        }
        if ((extended == 0) && (*(char *)&(local_30[1].next)->next == '^')) {
          return 1;
        }
      }
    }
    channel_local._4_4_ = 0;
  }
  return channel_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_poll_channel_read(LIBSSH2_CHANNEL *channel, int extended)
{
    LIBSSH2_SESSION *session;
    LIBSSH2_PACKET *packet;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    session = channel->session;
    packet = _libssh2_list_first(&session->packets);

    while(packet) {
        if(packet->data_len < 5) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Packet too small");
        }

        if(channel->local.id == _libssh2_ntohu32(packet->data + 1)) {
            if(extended == 1 &&
                (packet->data[0] == SSH_MSG_CHANNEL_EXTENDED_DATA
                 || packet->data[0] == SSH_MSG_CHANNEL_DATA)) {
                return 1;
            }
            else if(extended == 0 &&
                    packet->data[0] == SSH_MSG_CHANNEL_DATA) {
                return 1;
            }
            /* else - no data of any type is ready to be read */
        }
        packet = _libssh2_list_next(&packet->node);
    }

    return 0;
}